

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Report_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IO_Report_PDU::Encode(IO_Report_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference this_00;
  StandardVariable *pSVar3;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  IO_Report_PDU *this_local;
  
  IO_Header::Encode(&this->super_IO_Header,stream);
  pKVar2 = KDataStream::operator<<(stream,this->m_ui16SimSrc);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8RptTyp);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8Padding);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,(DataTypeBase *)&this->m_AtkEntityID);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,(DataTypeBase *)&this->m_TgtEntityID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32Padding);
  KDataStream::operator<<(pKVar2,this->m_ui16NumStdVarRec);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
            ::begin(&this->m_vStdVarRecs);
  local_28._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
       ::end(&this->m_vStdVarRecs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
              ::operator*(&citrEnd);
    pSVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator->(this_00);
    (*(pSVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pSVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void IO_Report_PDU::Encode( KDataStream & stream ) const
{
    IO_Header::Encode( stream );

    stream << m_ui16SimSrc
           << m_ui8RptTyp
           << m_ui8Padding
           << KDIS_STREAM m_AtkEntityID
           << KDIS_STREAM m_TgtEntityID
           << m_ui32Padding
           << m_ui16NumStdVarRec;

    vector<StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }
}